

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

void Fra_SmlCheckOutputSavePattern(Fra_Man_t *p,Aig_Obj_t *pObjPo)

{
  long lVar1;
  Fra_Sml_t *pFVar2;
  Aig_Man_t *pAVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  int *piVar7;
  void *pvVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  pFVar2 = p->pSml;
  uVar9 = (ulong)pFVar2->nWordsTotal;
  bVar14 = 0 < (long)uVar9;
  if (0 < (long)uVar9) {
    lVar11 = (long)(*(int *)(((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe) + 0x24) *
                   pFVar2->nWordsTotal);
    piVar7 = (int *)((long)&pFVar2[1].pAig + lVar11 * 4);
    if (*piVar7 == 0) {
      uVar12 = 0;
      do {
        if (uVar9 - 1 == uVar12) goto LAB_00605b32;
        uVar13 = uVar12 + 1;
        lVar1 = uVar12 * 4;
        uVar12 = uVar13;
      } while (*(int *)((long)&pFVar2[1].pAig + lVar1 + lVar11 * 4 + 4) == 0);
      bVar14 = uVar13 < uVar9;
    }
    else {
      uVar13 = 0;
    }
    if (bVar14) {
      uVar10 = 0;
      while (((uint)piVar7[uVar13] >> (uVar10 & 0x1f) & 1) == 0) {
        uVar10 = uVar10 + 1;
        if (uVar10 == 0x20) {
          __assert_fail("k < 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                        ,0x129,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
        }
      }
      pAVar3 = p->pManFraig;
      pvVar8 = malloc((long)pAVar3->nObjs[2] * 4 + 4);
      pAVar4 = p->pManAig;
      pVVar5 = pAVar4->vCis;
      if (0 < pVVar5->nSize) {
        ppvVar6 = pVVar5->pArray;
        lVar11 = 0;
        do {
          *(uint *)((long)pvVar8 + lVar11 * 4) =
               (uint)((*(uint *)((long)&pFVar2[1].pAig +
                                (long)pFVar2->nWordsTotal *
                                (long)*(int *)((long)ppvVar6[lVar11] + 0x24) * 4 + uVar13 * 4) >>
                       (uVar10 & 0x1f) & 1) != 0);
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar5->nSize);
      }
      *(int *)((long)pvVar8 + (long)pAVar4->nObjs[2] * 4) = pObjPo->Id;
      if (pAVar3->pData == (void *)0x0) {
        pAVar3->pData = pvVar8;
        return;
      }
      __assert_fail("p->pManFraig->pData == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x136,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
    }
  }
LAB_00605b32:
  __assert_fail("i < p->pSml->nWordsTotal",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x124,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Fra_SmlCheckOutputSavePattern( Fra_Man_t * p, Aig_Obj_t * pObjPo )
{ 
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Fra_ObjSim(p->pSml, pFanin->Id);
    for ( i = 0; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->pSml->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pManFraig)+1 );
    Aig_ManForEachCi( p->pManAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Fra_ObjSim(p->pSml, pObjPi->Id), BestPat);
//        printf( "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pManAig)] = pObjPo->Id;
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}